

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall Attribute::SetDataSize(Attribute *this)

{
  pointer pAVar1;
  size_t sVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  unsigned_long_long size;
  long lVar5;
  
  lVar5 = 0;
  size = 0;
  for (uVar4 = 0;
      pAVar1 = (this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->attrValues).
                             super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pAVar1) / 0x28);
      uVar4 = uVar4 + 1) {
    sVar2 = AnyType::EncodedSize((AnyType *)((long)&(pAVar1->super_DerBase)._vptr_DerBase + lVar5));
    size = size + sVar2;
    lVar5 = lVar5 + 0x28;
  }
  sVar2 = GetSizeBytes(size);
  sVar3 = DerBase::EncodedSize(&(this->attrType).super_DerBase);
  sVar2 = sVar3 + sVar2 + size + 1;
  (this->super_DerBase).cbData = sVar2;
  return sVar2;
}

Assistant:

virtual size_t SetDataSize() override
	{
		size_t cbNeeded = 0; // For the set byte

		// First, calculate how much is needed for the set of attrValues
		for (size_t i = 0; i < attrValues.size(); ++i)
		{
			cbNeeded += attrValues[i].EncodedSize();
		}

		cbNeeded += GetSizeBytes(cbNeeded) + 1;
		// And next, the sequence 
		cbNeeded += attrType.EncodedSize();
		return (cbData = cbNeeded);
	}